

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O3

void __thiscall cmStdIoConnection::SetServer(cmStdIoConnection *this,cmServerBase *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  cmConnection::SetServer((cmConnection *)this,s);
  if (s != (cmServerBase *)0x0) {
    SetupStream((cmStdIoConnection *)&stack0xffffffffffffffd8,(int)this);
    _Var3._M_pi = _Stack_20._M_pi;
    peVar2 = local_28;
    local_28 = (element_type *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->ReadStream).super_uv_handle_ptr_base_<uv_stream_s>.handle.
             super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->ReadStream).super_uv_handle_ptr_base_<uv_stream_s>.handle.
    super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->ReadStream).super_uv_handle_ptr_base_<uv_stream_s>.handle.
    super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    ::cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_stream_s> *)&stack0xffffffffffffffd8);
    SetupStream((cmStdIoConnection *)&stack0xffffffffffffffd8,(int)this);
    _Var3._M_pi = _Stack_20._M_pi;
    peVar2 = local_28;
    local_28 = (element_type *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->super_cmEventBasedConnection).WriteStream.super_uv_handle_ptr_base_<uv_stream_s>
             .handle.super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->super_cmEventBasedConnection).WriteStream.super_uv_handle_ptr_base_<uv_stream_s>.handle.
    super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->super_cmEventBasedConnection).WriteStream.super_uv_handle_ptr_base_<uv_stream_s>.handle.
    super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    ::cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_stream_s> *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void cmStdIoConnection::SetServer(cmServerBase* s)
{
  cmConnection::SetServer(s);
  if (!s) {
    return;
  }

  this->ReadStream = SetupStream(0);
  this->WriteStream = SetupStream(1);
}